

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CheckObjectName(Parse *pParse,char *zName,char *zType,char *zTblName)

{
  int iVar1;
  sqlite3 *in_RCX;
  char *in_RSI;
  Parse *in_RDI;
  sqlite3 *db;
  char *in_stack_ffffffffffffffc8;
  sqlite3 *db_00;
  
  db_00 = in_RDI->db;
  iVar1 = sqlite3WritableSchema(db_00);
  if (((iVar1 == 0) && (((byte)(db_00->init).field_0x6 >> 1 & 1) == 0)) &&
     (sqlite3Config.bExtraSchemaChecks != '\0')) {
    if ((db_00->init).busy == '\0') {
      if (((in_RDI->nested == '\0') && (iVar1 = sqlite3_strnicmp(in_RSI,"sqlite_",7), iVar1 == 0))
         || ((iVar1 = sqlite3ReadOnlyShadowTables(db_00), iVar1 != 0 &&
             (iVar1 = sqlite3ShadowTableName(in_RCX,(char *)db_00), iVar1 != 0)))) {
        sqlite3ErrorMsg(in_RDI,"object name reserved for internal use: %s",in_RSI);
        return 1;
      }
    }
    else {
      iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffc8,(char *)0x1d5f28);
      if (((iVar1 != 0) ||
          (iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffc8,(char *)0x1d5f47), iVar1 != 0)) ||
         (iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffc8,(char *)0x1d5f66), iVar1 != 0)) {
        sqlite3ErrorMsg(in_RDI,"");
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(
  Parse *pParse,            /* Parsing context */
  const char *zName,        /* Name of the object to check */
  const char *zType,        /* Type of this object */
  const char *zTblName      /* Parent table name for triggers and indexes */
){
  sqlite3 *db = pParse->db;
  if( sqlite3WritableSchema(db)
   || db->init.imposterTable
   || !sqlite3Config.bExtraSchemaChecks
  ){
    /* Skip these error checks for writable_schema=ON */
    return SQLITE_OK;
  }
  if( db->init.busy ){
    if( sqlite3_stricmp(zType, db->init.azInit[0])
     || sqlite3_stricmp(zName, db->init.azInit[1])
     || sqlite3_stricmp(zTblName, db->init.azInit[2])
    ){
      sqlite3ErrorMsg(pParse, ""); /* corruptSchema() will supply the error */
      return SQLITE_ERROR;
    }
  }else{
    if( (pParse->nested==0 && 0==sqlite3StrNICmp(zName, "sqlite_", 7))
     || (sqlite3ReadOnlyShadowTables(db) && sqlite3ShadowTableName(db, zName))
    ){
      sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s",
                      zName);
      return SQLITE_ERROR;
    }

  }
  return SQLITE_OK;
}